

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O2

void __thiscall unitOps_inequality1_Test::TestBody(unitOps_inequality1_Test *this)

{
  bool bVar1;
  pointer *__ptr;
  int iVar2;
  char *pcVar3;
  double dVar4;
  double dVar5;
  unit u2;
  unit u3;
  int eqFailNeg;
  int eqFailPos;
  unit u1;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  float local_3c;
  double local_38;
  double local_30;
  
  eqFailPos = 0;
  eqFailNeg = 0;
  iVar2 = 0;
  dVar4 = 1.0;
  while (dVar4 < 1.000002) {
    local_3c = (float)dVar4;
    dVar5 = 1e-05;
    local_38 = dVar4;
    while (2.501e-06 < dVar5) {
      u1.multiplier_ = local_3c;
      u1.base_units_ = (unit_data)0x39d2;
      u2.multiplier_ = (float)(local_38 + dVar5);
      u2.base_units_ = (unit_data)0x39d2;
      u3.multiplier_ = (float)(local_38 - dVar5);
      u3.base_units_ = (unit_data)0x39d2;
      local_30 = dVar5;
      bVar1 = units::unit::operator==(&u1,&u2);
      if (bVar1) {
        eqFailPos = eqFailPos + 1;
      }
      bVar1 = units::unit::operator==(&u1,&u3);
      if (bVar1) {
        iVar2 = iVar2 + 1;
        eqFailNeg = iVar2;
      }
      dVar5 = local_30 + -1e-08;
    }
    dVar4 = local_38 + 1e-09;
  }
  u2.multiplier_ = 0.0;
  testing::internal::CmpHelperEQ<int,int>((internal *)&u1,"eqFailPos","0",&eqFailPos,(int *)&u2);
  if (u1.multiplier_._0_1_ == '\0') {
    testing::Message::Message((Message *)&u2);
    if (local_48._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_48._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&u3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x1a6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&u3,(Message *)&u2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&u3);
    if ((long *)CONCAT44(u2.base_units_,u2.multiplier_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(u2.base_units_,u2.multiplier_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_48);
  u2.multiplier_ = 0.0;
  testing::internal::CmpHelperEQ<int,int>((internal *)&u1,"eqFailNeg","0",&eqFailNeg,(int *)&u2);
  if (u1.multiplier_._0_1_ == '\0') {
    testing::Message::Message((Message *)&u2);
    if (local_48._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_48._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&u3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x1a7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&u3,(Message *)&u2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&u3);
    if ((long *)CONCAT44(u2.base_units_,u2.multiplier_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(u2.base_units_,u2.multiplier_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_48);
  return;
}

Assistant:

TEST(unitOps, inequality1)
{
    int eqFailPos = 0;
    int eqFailNeg = 0;
    double start = 1.0;
    while (start < (1.0 + 2e-6)) {
        double diff = 1e-5;
        while (diff > 2.501e-6) {
            auto u1 = unit(start, V);
            auto u2 = unit(start + diff, V);
            auto u3 = unit(start - diff, V);
            if (u1 == u2) {
                ++eqFailPos;
            }
            if (u1 == u3) {
                ++eqFailNeg;
            }
            diff -= 1e-8;
        }
        start += 1e-9;
    }
    EXPECT_EQ(eqFailPos, 0);
    EXPECT_EQ(eqFailNeg, 0);
}